

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O0

TileNode * createTileNode(int location,char type)

{
  TileNode *pTVar1;
  TileNode *tileNode;
  char type_local;
  int location_local;
  
  pTVar1 = (TileNode *)malloc(0x10);
  pTVar1->next = (TileNode *)0x0;
  pTVar1->location = location;
  pTVar1->type = type;
  return pTVar1;
}

Assistant:

struct TileNode *createTileNode(int location, char type) {
    struct TileNode *tileNode = NULL;

    tileNode = (struct TileNode *) malloc(sizeof(struct TileNode));

    tileNode->next = NULL;
    tileNode->location = location;
    tileNode->type = type;

    return tileNode;
}